

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O1

void attach_egg_hatch_timeout(obj *egg)

{
  uint uVar1;
  ulong when;
  
  stop_timer(egg->olev,4,egg);
  when = 0x97;
  do {
    uVar1 = mt_random();
    if (0x95 < (uint)((ulong)uVar1 % (when & 0xffffffff))) {
      start_timer(egg->olev,when,2,4,egg);
      return;
    }
    when = when + 1;
  } while ((int)when != 0xc9);
  return;
}

Assistant:

void attach_egg_hatch_timeout(struct obj *egg)
{
	int i;

	/* stop previous timer, if any */
	stop_timer(egg->olev, HATCH_EGG, egg);

	/*
	 * Decide if and when to hatch the egg.  The old hatch_it() code tried
	 * once a turn from age 151 to 200 (inclusive), hatching if it rolled
	 * a number x, 1<=x<=age, where x>150.  This yields a chance of
	 * hatching > 99.9993%.  Mimic that here.
	 */
	for (i = (MAX_EGG_HATCH_TIME-50)+1; i <= MAX_EGG_HATCH_TIME; i++)
	    if (rnd(i) > 150) {
		/* egg will hatch */
		start_timer(egg->olev, (long)i, TIMER_OBJECT,
						HATCH_EGG, egg);
		break;
	    }
}